

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  long lVar4;
  bool bVar5;
  
  psVar2 = z->img_buffer;
  if (z->img_buffer_end <= psVar2) {
    if (z->read_from_callbacks == 0) {
      sVar3 = '\0';
      goto LAB_001c44ad;
    }
    stbi__refill_buffer(z);
    psVar2 = z->img_buffer;
  }
  z->img_buffer = psVar2 + 1;
  sVar3 = *psVar2;
LAB_001c44ad:
  lVar4 = 0;
  do {
    if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001c44ca:
      bVar5 = z->img_buffer < z->img_buffer_end;
    }
    else {
      iVar1 = (*(z->io).eof)(z->io_user_data);
      if (iVar1 == 0) {
        bVar5 = true;
      }
      else {
        if (z->read_from_callbacks != 0) goto LAB_001c44ca;
        bVar5 = false;
      }
    }
    if ((sVar3 == '\n') || (!bVar5)) goto LAB_001c45a8;
    buffer[lVar4] = sVar3;
    if (lVar4 == 0x3fe) break;
    psVar2 = z->img_buffer;
    if (psVar2 < z->img_buffer_end) {
LAB_001c4528:
      z->img_buffer = psVar2 + 1;
      sVar3 = *psVar2;
    }
    else {
      if (z->read_from_callbacks != 0) {
        stbi__refill_buffer(z);
        psVar2 = z->img_buffer;
        goto LAB_001c4528;
      }
      sVar3 = '\0';
    }
    lVar4 = lVar4 + 1;
  } while( true );
LAB_001c4542:
  if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001c455c:
    if (z->img_buffer_end <= z->img_buffer) goto LAB_001c45a2;
  }
  else {
    iVar1 = (*(z->io).eof)(z->io_user_data);
    if (iVar1 != 0) {
      if (z->read_from_callbacks != 0) goto LAB_001c455c;
      goto LAB_001c45a2;
    }
  }
  psVar2 = z->img_buffer;
  if (z->img_buffer_end <= psVar2) {
    if (z->read_from_callbacks == 0) goto LAB_001c4542;
    stbi__refill_buffer(z);
    psVar2 = z->img_buffer;
  }
  z->img_buffer = psVar2 + 1;
  if (*psVar2 == '\n') {
LAB_001c45a2:
    lVar4 = 0x3ff;
LAB_001c45a8:
    buffer[lVar4] = '\0';
    return buffer;
  }
  goto LAB_001c4542;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}